

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

void __thiscall libcellml::Units::addUnit(Units *this,string *reference,double exponent,string *id)

{
  allocator<char> local_49;
  string local_48;
  string *local_28;
  string *id_local;
  double exponent_local;
  string *reference_local;
  Units *this_local;
  
  local_28 = id;
  id_local = (string *)exponent;
  exponent_local = (double)reference;
  reference_local = (string *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"0",&local_49);
  addUnit(this,reference,&local_48,(double)id_local,1.0,local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  return;
}

Assistant:

void Units::addUnit(const std::string &reference, double exponent, const std::string &id)
{
    addUnit(reference, "0", exponent, 1.0, id);
}